

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

void Frc_DumpGraphIntoFile(Frc_Man_t *p)

{
  int iVar1;
  FILE *__stream;
  bool bVar2;
  uint local_34;
  int local_30;
  int Counter;
  int k;
  int i;
  Frc_Obj_t *pNext;
  Frc_Obj_t *pThis;
  FILE *pFile;
  Frc_Man_t *p_local;
  
  local_34 = 0;
  Counter = 0;
  do {
    bVar2 = false;
    if (Counter < p->nObjData) {
      pNext = Frc_ManObj(p,Counter);
      bVar2 = pNext != (Frc_Obj_t *)0x0;
    }
    if (!bVar2) {
      __stream = fopen("x\\large\\aig\\dg1.g","w");
      Counter = 0;
      while( true ) {
        bVar2 = false;
        if (Counter < p->nObjData) {
          pNext = Frc_ManObj(p,Counter);
          bVar2 = pNext != (Frc_Obj_t *)0x0;
        }
        if (!bVar2) break;
        local_30 = 0;
        while( true ) {
          bVar2 = false;
          if (local_30 < (int)pNext->nFanouts) {
            _k = Frc_ObjFanout(pNext,local_30);
            bVar2 = _k != (Frc_Obj_t *)0x0;
          }
          if (!bVar2) break;
          if (((pNext->field_9).iFanin != 0xffffffff) && ((_k->field_9).iFanin != 0xffffffff)) {
            fprintf(__stream,"%d %d\n",(ulong)(pNext->field_9).iFanin,(ulong)(_k->field_9).iFanin);
          }
          local_30 = local_30 + 1;
        }
        iVar1 = Frc_ObjSize(pNext);
        Counter = iVar1 + Counter;
      }
      fclose(__stream);
      return;
    }
    if (Counter == 0) {
LAB_0094fc92:
      (pNext->field_9).iFanin = 0xffffffff;
    }
    else {
      iVar1 = Frc_ObjIsCi(pNext);
      if (iVar1 == 0) {
LAB_0094fc70:
        iVar1 = Frc_ObjIsNode(pNext);
        if (iVar1 == 0) goto LAB_0094fc92;
      }
      else {
        iVar1 = Frc_ObjFanoutsAreCos(pNext);
        if (iVar1 != 0) goto LAB_0094fc70;
      }
      (pNext->field_9).iFanin = local_34;
      local_34 = local_34 + 1;
    }
    iVar1 = Frc_ObjSize(pNext);
    Counter = iVar1 + Counter;
  } while( true );
}

Assistant:

void Frc_DumpGraphIntoFile( Frc_Man_t * p )
{
    FILE * pFile;
    Frc_Obj_t * pThis, * pNext;
    int i, k, Counter = 0;
    // assign numbers to CIs and internal nodes
    Frc_ManForEachObj( p, pThis, i )
    {
        if ( i && ((Frc_ObjIsCi(pThis) && !Frc_ObjFanoutsAreCos(pThis)) || Frc_ObjIsNode(pThis)) )
            pThis->iFanin = Counter++;
        else
            pThis->iFanin = ~0;
    }
    // assign numbers to all other nodes
    pFile = fopen( "x\\large\\aig\\dg1.g", "w" );
    Frc_ManForEachObj( p, pThis, i )
    {
        Frc_ObjForEachFanout( pThis, pNext, k )
        {
            if ( ~pThis->iFanin && ~pNext->iFanin )
                fprintf( pFile, "%d %d\n", pThis->iFanin, pNext->iFanin );
        }
    }
    fclose( pFile );
}